

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

void __thiscall BuildStatus::PrintStatus(BuildStatus *this,Edge *edge,EdgeStatus status)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long *plVar3;
  size_type *psVar4;
  string to_print;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar2 = *(int *)this->config_;
  if (iVar2 != 1) {
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"description","");
    Edge::GetBinding(&local_70,edge,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((iVar2 == 2) || (local_70._M_string_length == 0)) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"command","");
      Edge::GetBinding(&local_b0,edge,&local_90);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != paVar1) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    FormatProgressStatus_abi_cxx11_(&local_90,this,this->progress_status_format_,status);
    plVar3 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)local_70._M_dataplus._M_p);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_b0.field_2._M_allocated_capacity = *psVar4;
      local_b0.field_2._8_8_ = plVar3[3];
      local_b0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar4;
      local_b0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_b0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    LinePrinter::Print(&this->printer_,&local_50,(uint)(iVar2 != 2));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void BuildStatus::PrintStatus(const Edge* edge, EdgeStatus status) {
  if (config_.verbosity == BuildConfig::QUIET)
    return;

  bool force_full_command = config_.verbosity == BuildConfig::VERBOSE;

  string to_print = edge->GetBinding("description");
  if (to_print.empty() || force_full_command)
    to_print = edge->GetBinding("command");

  to_print = FormatProgressStatus(progress_status_format_, status) + to_print;

  printer_.Print(to_print,
                 force_full_command ? LinePrinter::FULL : LinePrinter::ELIDE);
}